

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

int __thiscall asmjit::v1_14::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  ZoneAllocator *allocator;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Error EVar4;
  Error EVar5;
  uint64_t in_RCX;
  undefined8 *in_RDX;
  uint uVar6;
  Section *section;
  
  if ((this->_environment)._arch == kUnknown) {
    if (*(int *)&this->field_0xd0 != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                 ,0x9d,"_emitters.empty()");
    }
    allocator = &this->_allocator;
    EVar4 = ZoneVector<asmjit::v1_14::Section_*>::willGrow(&this->_sections,allocator,1);
    EVar5 = ZoneVector<asmjit::v1_14::Section_*>::willGrow(&this->_sectionsByOrder,allocator,1);
    uVar6 = EVar5 | EVar4;
    if (uVar6 == 0) {
      uVar6 = 1;
      section = (Section *)ZoneAllocator::allocZeroed(allocator,0x68);
      if (section != (Section *)0x0) {
        section->_flags = kReadOnly|kExecutable;
        *(undefined8 *)&section->_name = 0x747865742e;
        ZoneVector<asmjit::v1_14::Section_*>::appendUnsafe(&this->_sections,&section);
        ZoneVector<asmjit::v1_14::Section_*>::appendUnsafe(&this->_sectionsByOrder,&section);
        this->_environment = *(Environment *)ctx;
        uVar1 = in_RDX[1];
        uVar2 = in_RDX[2];
        uVar3 = in_RDX[3];
        *(undefined8 *)&this->_cpuFeatures = *in_RDX;
        *(undefined8 *)&this->field_0x10 = uVar1;
        *(undefined8 *)&this->field_0x18 = uVar2;
        *(undefined8 *)&this->field_0x20 = uVar3;
        this->_baseAddress = in_RCX;
        return 0;
      }
    }
    Zone::reset(&this->_zone,kSoft);
  }
  else {
    uVar6 = 6;
  }
  return uVar6;
}

Assistant:

Error CodeHolder::init(const Environment& environment, const CpuFeatures& cpuFeatures, uint64_t baseAddress) noexcept {
  // Cannot reinitialize if it's locked or there is one or more emitter attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached.
  ASMJIT_ASSERT(_emitters.empty());

  // Create a default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_allocator) |
              _sectionsByOrder.willGrow(&_allocator);
  if (err == kErrorOk) {
    Section* section = _allocator.allocZeroedT<Section>();
    if (ASMJIT_LIKELY(section)) {
      section->_flags = SectionFlags::kExecutable | SectionFlags::kReadOnly;
      CodeHolder_setSectionDefaultName(section, '.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(section);
      _sectionsByOrder.appendUnsafe(section);
    }
    else {
      err = DebugUtils::errored(kErrorOutOfMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _zone.reset();
    return err;
  }
  else {
    _environment = environment;
    _cpuFeatures = cpuFeatures;
    _baseAddress = baseAddress;
    return kErrorOk;
  }
}